

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::outputrows_da<pltcalc::outrec_granular_const&>
               (outrec_granular *o,int type,FILE *outFile)

{
  int strLen;
  long lVar1;
  int occ_day;
  int occ_month;
  int occ_year;
  char buffer [4096];
  
  lVar1 = 0x5a0;
  if (granular_date_ == 0) {
    lVar1 = 1;
  }
  d((long)(int)(o->occ_date_id / lVar1),&occ_year,&occ_month,&occ_day);
  strLen = sprintf(buffer,"%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d,%d,%d\n",(double)o->mean,
                   (double)o->standard_deviation,(double)o->exp_value,type,
                   (ulong)(uint)o->summary_id,(ulong)(uint)o->period_no,(ulong)(uint)o->event_id,
                   (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day);
  writeoutput(buffer,strLen,outFile);
  return;
}

Assistant:

void outputrows_da(const T& o, const int type, FILE * outFile)
	{
		int occ_year, occ_month, occ_day;
		int days = o.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);

		char buffer[4096];
		int strLen;
		strLen = sprintf(buffer,
				"%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d,%d,%d\n",
				 type, o.summary_id, o.period_no, o.event_id,
				 o.mean, o.standard_deviation, o.exp_value,
				 occ_year, occ_month, occ_day);
		writeoutput(buffer, strLen, outFile);
	}